

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

void set_destroy(set s)

{
  long lVar1;
  size_t iterator;
  ulong uVar2;
  
  if (s != (set)0x0) {
    if (s->buckets != (bucket)0x0) {
      lVar1 = 0x10;
      for (uVar2 = 0; uVar2 < s->capacity; uVar2 = uVar2 + 1) {
        free(*(void **)((long)&s->buckets->count + lVar1));
        lVar1 = lVar1 + 0x18;
      }
      free(s->buckets);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void set_destroy(set s)
{
	if (s == NULL)
	{
		return;
	}

	if (s->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);
	}

	free(s);
}